

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

Socket<512UL> __thiscall
ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
openUnicastSocket<512ul>
          (Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *this,
          address_v4 *addr)

{
  bool v;
  type io;
  element_type *peVar1;
  socklen_t in_ECX;
  address_v4 *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Socket<512UL> SVar2;
  address local_80;
  basic_endpoint<asio::ip::udp> local_60;
  network_interface<0,_32,_41,_17> local_44 [3];
  multicast_enable_loopback<0,_34,_41,_19> local_2c;
  undefined1 local_21;
  address_v4 *local_20;
  address_v4 *addr_local;
  Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *this_local;
  Socket<512UL> *socket;
  
  local_21 = 0;
  local_20 = in_RDX;
  addr_local = addr;
  this_local = (Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog> *)this;
  io = std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator*
                 ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)addr);
  Socket<512UL>::Socket((Socket<512UL> *)this,io);
  peVar1 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  v = ::asio::ip::address_v4::is_loopback(local_20);
  ::asio::ip::detail::socket_option::multicast_enable_loopback<0,_34,_41,_19>::
  multicast_enable_loopback(&local_2c,v);
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::multicast_enable_loopback<0,34,41,19>>
            ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *)peVar1,
             &local_2c);
  peVar1 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  ::asio::ip::detail::socket_option::network_interface<0,_32,_41,_17>::network_interface
            (local_44,local_20);
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::network_interface<0,32,41,17>>
            ((basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> *)peVar1,
             local_44);
  peVar1 = std::
           __shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  ::asio::ip::address::address(&local_80,local_20);
  ::asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint(&local_60,&local_80,0);
  ::asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
            ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *)peVar1,
             (int)&local_60,__addr,in_ECX);
  SVar2.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar2.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Socket<512UL>)
         SVar2.mpImpl.
         super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Socket<BufferSize> openUnicastSocket(const ::asio::ip::address_v4& addr)
  {
    auto socket = Socket<BufferSize>{*mpService};
    socket.mpImpl->mSocket.set_option(
      ::asio::ip::multicast::enable_loopback(addr.is_loopback()));
    socket.mpImpl->mSocket.set_option(::asio::ip::multicast::outbound_interface(addr));
    socket.mpImpl->mSocket.bind(::asio::ip::udp::endpoint{addr, 0});
    return socket;
  }